

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cpp
# Opt level: O3

Sequence * __thiscall Sequence::operator=(Sequence *this,uint64_t seq)

{
  _Map_pointer ppiVar1;
  _Map_pointer ppiVar2;
  uint *puVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint *puVar9;
  
  ppiVar1 = (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  ppiVar2 = (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_start._M_node;
  puVar3 = (uint *)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                   super__Deque_impl_data._M_start._M_cur;
  uVar5 = (int)((ulong)((long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                              super__Deque_impl_data._M_start._M_last - (long)puVar3) >> 2) +
          (int)((ulong)((long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_cur -
                       (long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                             super__Deque_impl_data._M_finish._M_first) >> 2) +
          ((int)((ulong)((long)ppiVar1 - (long)ppiVar2) >> 3) + -1 +
          (uint)(ppiVar1 == (_Map_pointer)0x0)) * 0x80;
  if (0 < (int)uVar5) {
    lVar6 = (long)puVar3 -
            (long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_start._M_first;
    uVar7 = 0;
    do {
      uVar4 = (lVar6 >> 2) + uVar7;
      if ((long)uVar4 < 0) {
        uVar8 = (long)uVar4 >> 7;
LAB_001071ee:
        puVar9 = (uint *)(ppiVar2[uVar8] + uVar4 + uVar8 * -0x80);
      }
      else {
        puVar9 = puVar3;
        if (0x7f < uVar4) {
          uVar8 = uVar4 >> 7;
          goto LAB_001071ee;
        }
      }
      *puVar9 = (uint)((seq >> (uVar7 & 0x3f) & 1) != 0);
      uVar7 = uVar7 + 1;
      puVar3 = puVar3 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar7);
  }
  return this;
}

Assistant:

Sequence &Sequence::operator=(uint64_t seq) {
    auto n = size();
    for (auto i = 0; i < n; ++i) {
        m_bits[i] = (seq >> i) & 1;
    }
    return *this;
}